

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_getopt_long.c
# Opt level: O2

void permute_args(int panonopt_start,int panonopt_end,int opt_end,char **nargv)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  
  uVar7 = opt_end - panonopt_end;
  lVar3 = (long)(panonopt_end - panonopt_start) % (long)(int)uVar7;
  uVar8 = uVar7;
  while (uVar4 = (uint)lVar3, uVar4 != 0) {
    lVar3 = (long)(int)uVar8 % (long)(int)uVar4;
    uVar8 = uVar4;
  }
  iVar5 = (opt_end - panonopt_start) / (int)uVar8;
  uVar6 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  uVar10 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar10 = uVar6;
  }
  for (; uVar6 != uVar10; uVar6 = uVar6 + 1) {
    uVar1 = uVar6 + (long)panonopt_end;
    uVar9 = uVar1 & 0xffffffff;
    iVar11 = iVar5;
    while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
      uVar8 = uVar7;
      if (panonopt_end <= (int)uVar9) {
        uVar8 = -(panonopt_end - panonopt_start);
      }
      uVar8 = (int)uVar9 + uVar8;
      uVar9 = (ulong)uVar8;
      pcVar2 = nargv[(int)uVar8];
      nargv[(int)uVar8] = nargv[uVar1];
      nargv[uVar1] = pcVar2;
    }
  }
  return;
}

Assistant:

static void
permute_args(int panonopt_start, int panonopt_end, int opt_end,
	char * const *nargv)
{
	int cstart, cyclelen, i, j, ncycle, nnonopts, nopts, pos;
	char *swap;

	/*
	 * compute lengths of blocks and number and size of cycles
	 */
	nnonopts = panonopt_end - panonopt_start;
	nopts = opt_end - panonopt_end;
	ncycle = gcd(nnonopts, nopts);
	cyclelen = (opt_end - panonopt_start) / ncycle;

	for (i = 0; i < ncycle; i++) {
		cstart = panonopt_end+i;
		pos = cstart;
		for (j = 0; j < cyclelen; j++) {
			if (pos >= panonopt_end)
				pos -= nnonopts;
			else
				pos += nopts;
			swap = nargv[pos];
			/* LINTED const cast */
			((char **) nargv)[pos] = nargv[cstart];
			/* LINTED const cast */
			((char **)nargv)[cstart] = swap;
		}
	}
}